

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddCleared<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value)

{
  Rep *pRVar1;
  int iVar2;
  
  pRVar1 = this->rep_;
  if (pRVar1 == (Rep *)0x0) {
    iVar2 = this->total_size_;
  }
  else {
    iVar2 = pRVar1->allocated_size;
    if (iVar2 != this->total_size_) goto LAB_00215b3d;
  }
  Reserve(this,iVar2 + 1);
  pRVar1 = this->rep_;
  iVar2 = pRVar1->allocated_size;
LAB_00215b3d:
  pRVar1->allocated_size = iVar2 + 1;
  pRVar1->elements[iVar2] = value;
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::AddCleared(
    typename TypeHandler::Type* value) {
  GOOGLE_DCHECK(GetArena() == NULL)
      << "AddCleared() can only be used on a RepeatedPtrField not on an arena.";
  GOOGLE_DCHECK(TypeHandler::GetArena(value) == NULL)
      << "AddCleared() can only accept values not on an arena.";
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  rep_->elements[rep_->allocated_size++] = value;
}